

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::deSerializeFloat
          (cbtQuantizedBvh *this,cbtQuantizedBvhFloatData *quantizedBvhFloatData)

{
  uint uVar1;
  cbtOptimizedBvhNode *pcVar2;
  cbtQuantizedBvhNodeData *pcVar3;
  cbtQuantizedBvhNode *pcVar4;
  cbtBvhSubtreeInfoData *pcVar5;
  int *piVar6;
  long lVar7;
  cbtOptimizedBvhNodeFloatData *dataIn;
  cbtOptimizedBvhNode local_78;
  
  cbtVector3::deSerializeFloat(&this->m_bvhAabbMax,&quantizedBvhFloatData->m_bvhAabbMax);
  cbtVector3::deSerializeFloat(&this->m_bvhAabbMin,&quantizedBvhFloatData->m_bvhAabbMin);
  cbtVector3::deSerializeFloat(&this->m_bvhQuantization,&quantizedBvhFloatData->m_bvhQuantization);
  local_78 = (cbtOptimizedBvhNode)ZEXT1664(ZEXT816(0) << 0x40);
  this->m_curNodeIndex = quantizedBvhFloatData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhFloatData->m_useQuantization != 0;
  uVar1 = quantizedBvhFloatData->m_numContiguousLeafNodes;
  cbtAlignedObjectArray<cbtOptimizedBvhNode>::resize(&this->m_contiguousNodes,uVar1,&local_78);
  if (uVar1 != 0) {
    dataIn = quantizedBvhFloatData->m_contiguousNodesPtr;
    for (lVar7 = 0; (ulong)(~((int)uVar1 >> 0x1f) & uVar1) << 6 != lVar7; lVar7 = lVar7 + 0x40) {
      cbtVector3::deSerializeFloat
                ((cbtVector3 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar7),
                 &dataIn->m_aabbMaxOrg);
      cbtVector3::deSerializeFloat
                ((cbtVector3 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar7),
                 &dataIn->m_aabbMinOrg);
      pcVar2 = (this->m_contiguousNodes).m_data;
      *(undefined8 *)(pcVar2->m_padding + lVar7 + -0xc) = *(undefined8 *)&dataIn->m_escapeIndex;
      piVar6 = &dataIn->m_triangleIndex;
      dataIn = dataIn + 1;
      *(int *)(pcVar2->m_padding + lVar7 + -4) = *piVar6;
    }
  }
  uVar1 = quantizedBvhFloatData->m_numQuantizedContiguousNodes;
  local_78.m_aabbMinOrg.m_floats = (cbtScalar  [4])ZEXT816(0);
  cbtAlignedObjectArray<cbtQuantizedBvhNode>::resize
            (&this->m_quantizedContiguousNodes,uVar1,(cbtQuantizedBvhNode *)&local_78);
  if (uVar1 != 0) {
    pcVar3 = quantizedBvhFloatData->m_quantizedContiguousNodesPtr;
    pcVar4 = (this->m_quantizedContiguousNodes).m_data;
    for (lVar7 = 0; (ulong)(~((int)uVar1 >> 0x1f) & uVar1) << 4 != lVar7; lVar7 = lVar7 + 0x10) {
      *(undefined4 *)((long)pcVar4->m_quantizedAabbMax + lVar7 + 6) =
           *(undefined4 *)((long)pcVar3->m_quantizedAabbMax + lVar7 + 6);
      *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar7) =
           *(undefined2 *)((long)pcVar3->m_quantizedAabbMax + lVar7);
      *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar7 + 2) =
           *(undefined2 *)((long)pcVar3->m_quantizedAabbMax + lVar7 + 2);
      *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar7 + 4) =
           *(undefined2 *)((long)pcVar3->m_quantizedAabbMax + lVar7 + 4);
      *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar7) =
           *(undefined2 *)((long)pcVar3->m_quantizedAabbMin + lVar7);
      *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar7 + 2) =
           *(undefined2 *)((long)pcVar3->m_quantizedAabbMin + lVar7 + 2);
      *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar7 + 4) =
           *(undefined2 *)((long)pcVar3->m_quantizedAabbMin + lVar7 + 4);
    }
  }
  this->m_traversalMode = quantizedBvhFloatData->m_traversalMode;
  uVar1 = quantizedBvhFloatData->m_numSubtreeHeaders;
  cbtAlignedObjectArray<cbtBvhSubtreeInfo>::resize
            (&this->m_SubtreeHeaders,uVar1,(cbtBvhSubtreeInfo *)&local_78);
  if (uVar1 != 0) {
    pcVar5 = quantizedBvhFloatData->m_subTreeInfoPtr;
    piVar6 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    for (lVar7 = 0; (ulong)(~((int)uVar1 >> 0x1f) & uVar1) * 0x14 - lVar7 != 0; lVar7 = lVar7 + 0x14
        ) {
      *(unsigned_short *)((long)piVar6 + -6) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMax + lVar7);
      *(unsigned_short *)(piVar6 + -1) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMax + lVar7 + 2);
      *(unsigned_short *)((long)piVar6 + -2) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMax + lVar7 + 4);
      ((cbtBvhSubtreeInfo *)(piVar6 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMin + lVar7);
      *(unsigned_short *)((long)piVar6 + -10) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMin + lVar7 + 2);
      *(unsigned_short *)(piVar6 + -2) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMin + lVar7 + 4);
      *(undefined8 *)piVar6 = *(undefined8 *)((long)pcVar5->m_quantizedAabbMin + lVar7 + -8);
      piVar6 = piVar6 + 8;
    }
  }
  return;
}

Assistant:

void cbtQuantizedBvh::deSerializeFloat(struct cbtQuantizedBvhFloatData& quantizedBvhFloatData)
{
	m_bvhAabbMax.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeFloat(quantizedBvhFloatData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhFloatData.m_curNodeIndex;
	m_useQuantization = quantizedBvhFloatData.m_useQuantization != 0;

	{
		int numElem = quantizedBvhFloatData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtOptimizedBvhNodeFloatData* memPtr = quantizedBvhFloatData.m_contiguousNodesPtr;

			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeFloat(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeFloat(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhFloatData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtQuantizedBvhNodeData* memPtr = quantizedBvhFloatData.m_quantizedContiguousNodesPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = cbtTraversalMode(quantizedBvhFloatData.m_traversalMode);

	{
		int numElem = quantizedBvhFloatData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			cbtBvhSubtreeInfoData* memPtr = quantizedBvhFloatData.m_subTreeInfoPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}
}